

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::InternalSwap
          (GeneratedCodeInfo_Annotation *this,GeneratedCodeInfo_Annotation *other)

{
  undefined4 uVar1;
  undefined4 uVar2;
  GeneratedCodeInfo_Annotation *this_00;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  *__b;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  *in_RSI;
  long in_RDI;
  UnknownFieldSet *in_stack_ffffffffffffff28;
  InternalMetadataWithArena *in_stack_ffffffffffffff30;
  RepeatedField<int> *in_stack_ffffffffffffffe8;
  RepeatedField<int> *this_01;
  RepeatedField<int> *in_stack_fffffffffffffff0;
  
  this_01 = (RepeatedField<int> *)(in_RSI + 1);
  if (((uint)*(undefined8 *)(in_RDI + 8) & 1) != 1) {
    uVar1 = this_01->current_size_;
    in_stack_fffffffffffffff0 = this_01;
    if ((uVar1 & 1) != 1) goto LAB_0052abb6;
  }
  uVar2 = this_01->current_size_;
  if ((uVar2 & 1) == 1) {
    internal::
    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
    ::
    PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
              ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                *)this_01);
    in_stack_ffffffffffffffe8 = this_01;
    this_01 = in_stack_fffffffffffffff0;
  }
  else {
    internal::
    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
    ::mutable_unknown_fields_slow(in_RSI);
    in_stack_ffffffffffffffe8 = this_01;
    this_01 = in_stack_fffffffffffffff0;
  }
  internal::InternalMetadataWithArena::DoSwap(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
LAB_0052abb6:
  std::swap<unsigned_int>((uint *)(in_RDI + 0x10),(uint *)(in_RSI + 2));
  RepeatedField<int>::InternalSwap(this_01,in_stack_ffffffffffffffe8);
  this_00 = (GeneratedCodeInfo_Annotation *)(in_RDI + 0x30);
  __b = in_RSI + 6;
  internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  GetArenaNoVirtual(this_00);
  std::swap<std::__cxx11::string*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)__b);
  std::swap<int>((int *)(in_RDI + 0x38),(int *)(in_RSI + 7));
  std::swap<int>((int *)(in_RDI + 0x3c),(int *)((long)&in_RSI[7].ptr_ + 4));
  return;
}

Assistant:

void GeneratedCodeInfo_Annotation::InternalSwap(GeneratedCodeInfo_Annotation* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  path_.InternalSwap(&other->path_);
  source_file_.Swap(&other->source_file_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  swap(begin_, other->begin_);
  swap(end_, other->end_);
}